

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::setTex2DBinding(ReferenceContext *this,int unitNdx,Texture2D *texture)

{
  int *piVar1;
  Texture2D *object;
  
  object = (this->m_textureUnits).
           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start[unitNdx].tex2DBinding;
  if (object != (Texture2D *)0x0) {
    rc::ObjectManager<sglr::rc::Texture>::releaseReference(&this->m_textures,&object->super_Texture)
    ;
    (this->m_textureUnits).
    super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
    ._M_impl.super__Vector_impl_data._M_start[unitNdx].tex2DBinding = (Texture2D *)0x0;
  }
  if (texture != (Texture2D *)0x0) {
    piVar1 = &(texture->super_Texture).super_NamedObject.m_refCount;
    *piVar1 = *piVar1 + 1;
    (this->m_textureUnits).
    super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
    ._M_impl.super__Vector_impl_data._M_start[unitNdx].tex2DBinding = texture;
  }
  return;
}

Assistant:

void ReferenceContext::setTex2DBinding (int unitNdx, Texture2D* texture)
{
	if (m_textureUnits[unitNdx].tex2DBinding)
	{
		m_textures.releaseReference(m_textureUnits[unitNdx].tex2DBinding);
		m_textureUnits[unitNdx].tex2DBinding = DE_NULL;
	}

	if (texture)
	{
		m_textures.acquireReference(texture);
		m_textureUnits[unitNdx].tex2DBinding = texture;
	}
}